

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CPDeclIdx cp_add(CPDecl *decl,CTInfo info,CTSize size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = decl->top;
  uVar3 = (ulong)uVar1;
  if (uVar3 < 100) {
    decl->stack[uVar3].info = info;
    decl->stack[uVar3].size = size;
    decl->stack[uVar3].sib = 0;
    decl->stack[uVar3].name.gcptr64 = 0;
    uVar2 = decl->pos;
    decl->stack[uVar3].next = decl->stack[uVar2].next;
    decl->stack[uVar2].next = (CTypeID1)uVar1;
    decl->top = uVar1 + 1;
    return uVar1;
  }
  cp_err(decl->cp,LJ_ERR_XLEVELS);
}

Assistant:

static CPDeclIdx cp_add(CPDecl *decl, CTInfo info, CTSize size)
{
  CPDeclIdx top = decl->top;
  if (top >= CPARSE_MAX_DECLSTACK) cp_err(decl->cp, LJ_ERR_XLEVELS);
  decl->stack[top].info = info;
  decl->stack[top].size = size;
  decl->stack[top].sib = 0;
  setgcrefnull(decl->stack[top].name);
  decl->stack[top].next = decl->stack[decl->pos].next;
  decl->stack[decl->pos].next = (CTypeID1)top;
  decl->top = top+1;
  return top;
}